

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  size_t sVar1;
  char *pcStack_60;
  char c;
  char *value_end;
  size_t value_len;
  char *value;
  int *piStack_40;
  int found;
  int *ret_local;
  size_t max_headers_local;
  size_t *num_headers_local;
  phr_header *headers_local;
  char *buf_end_local;
  char *buf_local;
  
  piStack_40 = ret;
  ret_local = (int *)max_headers;
  max_headers_local = (size_t)num_headers;
  num_headers_local = (size_t *)headers;
  headers_local = (phr_header *)buf_end;
  buf_end_local = buf;
  while( true ) {
    if ((phr_header *)buf_end_local == headers_local) {
      *piStack_40 = -2;
      return (char *)0x0;
    }
    if (*buf_end_local == '\r') {
      if ((phr_header *)(buf_end_local + 1) == headers_local) {
        *piStack_40 = -2;
        return (char *)0x0;
      }
      if (*(char *)&((phr_header *)(buf_end_local + 1))->name == '\n') {
        return buf_end_local + 2;
      }
      *piStack_40 = -1;
      return (char *)0x0;
    }
    if (*buf_end_local == '\n') {
      return buf_end_local + 1;
    }
    if (*(int **)max_headers_local == ret_local) break;
    if ((*(long *)max_headers_local == 0) || ((*buf_end_local != ' ' && (*buf_end_local != '\t'))))
    {
      num_headers_local[*(long *)max_headers_local * 4] = (size_t)buf_end_local;
      buf_end_local =
           findchar_fast(buf_end_local,(char *)headers_local,"",0x10,(int *)((long)&value + 4));
      if ((value._4_4_ == 0) && ((phr_header *)buf_end_local == headers_local)) {
        *piStack_40 = -2;
        return (char *)0x0;
      }
      while (*buf_end_local != ':') {
        if (token_char_map[(byte)*buf_end_local] == '\0') {
          *piStack_40 = -1;
          return (char *)0x0;
        }
        buf_end_local = buf_end_local + 1;
        if ((phr_header *)buf_end_local == headers_local) {
          *piStack_40 = -2;
          return (char *)0x0;
        }
      }
      sVar1 = num_headers_local[*(long *)max_headers_local * 4];
      num_headers_local[*(long *)max_headers_local * 4 + 1] = (long)buf_end_local - sVar1;
      if ((long)buf_end_local - sVar1 == 0) {
        *piStack_40 = -1;
        return (char *)0x0;
      }
      do {
        buf_end_local = buf_end_local + 1;
        if ((phr_header *)buf_end_local == headers_local) {
          *piStack_40 = -2;
          return (char *)0x0;
        }
      } while ((*buf_end_local == ' ') || (*buf_end_local == '\t'));
    }
    else {
      num_headers_local[*(long *)max_headers_local * 4] = 0;
      num_headers_local[*(long *)max_headers_local * 4 + 1] = 0;
    }
    buf_end_local =
         get_token_to_eol(buf_end_local,(char *)headers_local,(char **)&value_len,
                          (size_t *)&value_end,piStack_40);
    if (buf_end_local == (char *)0x0) {
      return (char *)0x0;
    }
    for (pcStack_60 = value_end + value_len;
        (pcStack_60 != (char *)value_len && ((pcStack_60[-1] == ' ' || (pcStack_60[-1] == '\t'))));
        pcStack_60 = pcStack_60 + -1) {
    }
    num_headers_local[*(long *)max_headers_local * 4 + 2] = value_len;
    num_headers_local[*(long *)max_headers_local * 4 + 3] = (long)pcStack_60 - value_len;
    *(long *)max_headers_local = *(long *)max_headers_local + 1;
  }
  *piStack_40 = -1;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            headers[*num_headers].name = buf;
            static const char ALIGNED(16) ranges1[] = "\x00 "  /* control chars and up to SP */
                                                      "\"\""   /* 0x22 */
                                                      "()"     /* 0x28,0x29 */
                                                      ",,"     /* 0x2c */
                                                      "//"     /* 0x2f */
                                                      ":@"     /* 0x3a-0x40 */
                                                      "[]"     /* 0x5b-0x5d */
                                                      "{\377"; /* 0x7b-0xff */
            int found;
            buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
            if (!found) {
                CHECK_EOF();
            }
            while (1) {
                if (*buf == ':') {
                    break;
                } else if (!token_char_map[(unsigned char)*buf]) {
                    *ret = -1;
                    return NULL;
                }
                ++buf;
                CHECK_EOF();
            }
            if ((headers[*num_headers].name_len = buf - headers[*num_headers].name) == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}